

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O3

size_t __thiscall proto2_unittest::TestMessageSetLite::ByteSizeLong(TestMessageSetLite *this)

{
  ulong uVar1;
  size_t sVar2;
  
  sVar2 = google::protobuf::internal::ExtensionSet::MessageSetByteSize
                    (&(this->field_0)._impl_._extensions_);
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    sVar2 = sVar2 + *(long *)((uVar1 & 0xfffffffffffffffe) + 0x10);
  }
  if (((int)sVar2 != 0) || ((this->field_0)._impl_._cached_size_.atom_ != 0)) {
    (this->field_0)._impl_._cached_size_.atom_ = (int)sVar2;
  }
  return sVar2;
}

Assistant:

::size_t TestMessageSetLite::ByteSizeLong() const {
  const TestMessageSetLite& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_set_byte_size_start:proto2_unittest.TestMessageSetLite)
  ::size_t total_size = this_._impl_._extensions_.MessageSetByteSize();
  if (this_._internal_metadata_.have_unknown_fields()) {
    total_size += ::_pbi::ComputeUnknownMessageSetItemsSize(
        this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString));
  }
  this_._impl_._cached_size_.Set(::_pbi::ToCachedSize(total_size));
  return total_size;
}